

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_18fc05::SQLiteBuildDB::buildStarted(SQLiteBuildDB *this,string *error_out)

{
  int iVar1;
  int __oflag;
  bool bVar2;
  string sStack_48;
  
  std::mutex::lock(&this->dbMutex);
  iVar1 = open(this,(char *)error_out,__oflag);
  if ((char)iVar1 != '\0') {
    iVar1 = sqlite3_exec(this->db,"BEGIN EXCLUSIVE;",0,0,0);
    if (iVar1 == 0) {
      bVar2 = true;
      goto LAB_0014ee7f;
    }
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&sStack_48,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&sStack_48);
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = false;
LAB_0014ee7f:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar2;
}

Assistant:

virtual bool buildStarted(std::string *error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out))
      return false;

    // Execute the entire build inside a single transaction.
    //
    // FIXME: We should revist this, as we probably wouldn't want a crash in the
    // build system to totally lose all build results.
    int result = sqlite3_exec(db, "BEGIN EXCLUSIVE;", nullptr, nullptr, nullptr);

    if (result != SQLITE_OK) {
      *error_out = getCurrentErrorMessage();
      return false;
    }

    return true;
  }